

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

int prf_model_traverse_io(prf_model_t *model,prf_cb_t callback)

{
  int iVar1;
  prf_state_t *state_00;
  void *in_RDX;
  _func_int_void_ptr_void_ptr *in_RSI;
  prf_model_t *in_RDI;
  int traverse;
  prf_state_t *state;
  prf_state_t *in_stack_00000048;
  prf_node_t *in_stack_00000050;
  
  state_00 = prf_state_create();
  state_00->model = in_RDI;
  state_00->traversal_method = 1;
  (state_00->callback).func = in_RSI;
  (state_00->callback).data = in_RDX;
  iVar1 = prf_model_traverse_io_(in_stack_00000050,in_stack_00000048);
  prf_state_destroy(state_00);
  return iVar1;
}

Assistant:

int
prf_model_traverse_io(
    prf_model_t * model,
    prf_cb_t callback )
{
    prf_state_t * state = NULL;
    int traverse;

    assert( model != NULL && model->header != NULL );

    state = prf_state_create();
    assert( state != NULL );
    state->model = model;
    state->traversal_method = PRF_TRAV_IN_ORDER;
    state->callback = callback;

    traverse = prf_model_traverse_io_( model->header, state );

    prf_state_destroy( state );

    return traverse;
}